

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::WeightParams::Clear(WeightParams *this)

{
  InternalMetadata *this_00;
  QuantizationParams *this_01;
  ulong uVar1;
  undefined8 *puVar2;
  
  (this->floatvalue_).current_size_ = 0;
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->float16value_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->rawvalue_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->int8rawvalue_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  uVar1 = uVar1 & 1;
  if (uVar1 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_01 = this->quantization_, this_01 != (QuantizationParams *)0x0)) {
    QuantizationParams::~QuantizationParams(this_01);
    operator_delete(this_01,0x28);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->quantization_ = (QuantizationParams *)0x0;
  this->isupdatable_ = false;
  if (uVar1 != 0) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
    return;
  }
  return;
}

Assistant:

void WeightParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.WeightParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  floatvalue_.Clear();
  float16value_.ClearToEmpty();
  rawvalue_.ClearToEmpty();
  int8rawvalue_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && quantization_ != nullptr) {
    delete quantization_;
  }
  quantization_ = nullptr;
  isupdatable_ = false;
  _internal_metadata_.Clear<std::string>();
}